

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_string_normalize_C(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  char cVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  archive_string *paVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  undefined7 uVar10;
  size_t sVar11;
  char *pcVar12;
  undefined4 uVar13;
  wchar_t wVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  char cVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  uint *puVar24;
  bool bVar25;
  long lStack_130;
  uint32_t local_124;
  size_t local_120;
  char *local_118;
  char *local_110;
  wchar_t local_104;
  long local_100;
  uint local_f4;
  long local_f0;
  long local_e8;
  wchar_t local_dc;
  ulong local_d8;
  char *local_d0;
  code *local_c8;
  undefined4 local_c0;
  uint32_t uc2;
  ulong local_b8;
  wchar_t local_ac;
  code *local_a8;
  uint local_9c;
  ulong local_98;
  ulong local_90;
  uint32_t ucx [10];
  wchar_t ccx [10];
  
  wVar14 = sc->flag;
  lStack_130 = 2;
  uVar10 = (undefined7)((ulong)sc >> 8);
  if (((uint)wVar14 >> 10 & 1) == 0) {
    if (((uint)wVar14 >> 0xc & 1) == 0) {
      if (((uint)wVar14 >> 8 & 1) == 0) {
        if (((uint)wVar14 >> 0xb & 1) == 0) {
          uVar20 = (uint)wVar14 >> 0xd & 1;
          uVar7 = (ulong)uVar20;
          lStack_130 = uVar7 + 1;
          local_c8 = unicode_to_utf8;
          if (uVar20 != 0) {
            local_c8 = unicode_to_utf16le;
          }
        }
        else {
          local_c8 = unicode_to_utf16be;
          uVar7 = 1;
        }
        cVar19 = (char)uVar7;
        local_c0 = 0;
      }
      else {
        local_c0 = (undefined4)CONCAT71(uVar10,((uint)wVar14 >> 9 & 1) == 0);
        local_c8 = unicode_to_utf8;
        lStack_130 = 1;
        cVar19 = '\0';
      }
      goto LAB_004ac811;
    }
    local_c0 = (undefined4)CONCAT71(uVar10,((uint)wVar14 >> 0xd & 1) == 0);
    local_c8 = unicode_to_utf16le;
  }
  else {
    local_c0 = (undefined4)CONCAT71(uVar10,((uint)wVar14 >> 0xb & 1) == 0);
    local_c8 = unicode_to_utf16be;
  }
  cVar19 = '\x01';
LAB_004ac811:
  local_100 = 1;
  local_9c = 4;
  if (((uint)wVar14 >> 0xb & 1) == 0) {
    if (((uint)wVar14 >> 0xd & 1) == 0) {
      local_a8 = cesu8_to_unicode;
      local_9c = 6;
      local_100 = lStack_130;
    }
    else {
      local_a8 = utf16le_to_unicode;
    }
  }
  else {
    local_a8 = utf16be_to_unicode;
  }
  local_120 = len;
  local_d0 = (char *)_p;
  paVar6 = archive_string_ensure(as,local_100 * len + lStack_130 + as->length);
  if (paVar6 == (archive_string *)0x0) {
    return L'\xffffffff';
  }
  pcVar17 = as->s + as->length;
  local_e8 = -lStack_130;
  pcVar18 = as->s + (as->buffer_length - lStack_130);
  local_104 = L'\0';
  pcVar12 = local_d0;
  sVar11 = local_120;
  local_f0 = lStack_130;
LAB_004ac8cd:
  do {
    uVar7 = (*local_a8)(&local_124,pcVar12,sVar11);
    uVar20 = (uint)uVar7;
    if (uVar20 == 0) {
switchD_004ad891_default:
      as->length = (long)pcVar17 - (long)as->s;
      *pcVar17 = '\0';
      if (cVar19 != '\0') {
        as->s[as->length + 1] = '\0';
        return local_104;
      }
      return local_104;
    }
    if ((int)uVar20 < 0) {
      lVar22 = sVar11 * local_100 + local_f0;
      local_120 = sVar11;
      while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,local_124), lVar8 == 0) {
        as->length = (long)pcVar17 - (long)as->s;
        paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar18 = as->s + local_e8 + as->buffer_length;
      }
      pcVar17 = pcVar17 + lVar8;
      pcVar12 = pcVar12 + -uVar20;
      sVar11 = local_120 - -uVar20;
    }
    else {
      local_110 = pcVar12;
      if (uVar20 == local_9c) {
        local_110 = (char *)0x0;
      }
      if ((char)local_c0 != '\0') {
        local_110 = (char *)0x0;
      }
      pcVar12 = pcVar12 + (uVar7 & 0xffffffff);
      sVar11 = sVar11 - (uVar7 & 0xffffffff);
      while( true ) {
        uVar20 = (*local_a8)(&uc2,pcVar12,sVar11);
        uVar3 = uc2;
        wVar14 = local_104;
        pcVar15 = local_110;
        uVar5 = local_124;
        uVar23 = (ulong)uVar20;
        uVar16 = uVar7 & 0xffffffff;
        local_b8 = uVar7;
        if ((int)uVar20 < 1) break;
        pcVar15 = pcVar12;
        if (uVar20 == local_9c) {
          pcVar15 = (char *)0x0;
        }
        if ((char)local_c0 != '\0') {
          pcVar15 = (char *)0x0;
        }
        local_120 = sVar11 - uVar20;
        if ((0x1d2ff < uc2) || (uVar21 = uc2 >> 8, ""[uVar21] == '\0')) {
          if (local_110 == (char *)0x0) {
            lVar22 = local_120 * local_100 + local_f0;
            local_118 = pcVar15;
            while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,local_124), lVar8 == 0)
            {
              as->length = (long)pcVar17 - (long)as->s;
              paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
              if (paVar6 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              pcVar17 = as->s + as->length;
              pcVar18 = as->s + local_e8 + as->buffer_length;
            }
            pcVar17 = pcVar17 + lVar8;
            pcVar15 = local_118;
            local_124 = uc2;
          }
          else {
            if (pcVar18 < pcVar17 + uVar16) {
              as->length = (long)pcVar17 - (long)as->s;
              paVar6 = archive_string_ensure
                                 (as,local_120 * local_100 + local_f0 + as->buffer_length);
              if (paVar6 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              pcVar17 = as->s + as->length;
              pcVar18 = as->s + local_e8 + as->buffer_length;
            }
            local_124 = uc2;
            switch((int)local_b8) {
            case 4:
switchD_004acc4a_caseD_4:
              cVar1 = *local_110;
              local_110 = local_110 + 1;
              *pcVar17 = cVar1;
              pcVar17 = pcVar17 + 1;
            case 3:
switchD_004acc4a_caseD_3:
              cVar1 = *local_110;
              local_110 = local_110 + 1;
              *pcVar17 = cVar1;
              pcVar17 = pcVar17 + 1;
            case 2:
switchD_004acc4a_caseD_2:
              cVar1 = *local_110;
              local_110 = local_110 + 1;
              *pcVar17 = cVar1;
              pcVar17 = pcVar17 + 1;
            case 1:
switchD_004acc4a_caseD_1:
              *pcVar17 = *local_110;
              pcVar17 = pcVar17 + 1;
              local_124 = uc2;
            }
          }
          goto switchD_004acc4a_default;
        }
        if (local_124 - 0x1100 < 0x13) {
          if (uc2 - 0x1161 < 0x15) {
            uVar23 = uVar7;
            pcVar15 = (char *)0x0;
            local_124 = ((local_124 - 0x1100) * 0x15 + (uc2 - 0x1161)) * 0x1c + 0xac00;
          }
          else {
            uVar13 = (undefined4)uVar7;
            if (local_110 == (char *)0x0) {
              lVar22 = local_120 * local_100 + local_f0;
              local_118 = pcVar15;
              local_d8 = uVar23;
              while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,local_124),
                    lVar8 == 0) {
                as->length = (long)pcVar17 - (long)as->s;
                paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
                if (paVar6 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar17 = as->s + as->length;
                pcVar18 = as->s + local_e8 + as->buffer_length;
              }
LAB_004aced1:
              pcVar17 = pcVar17 + lVar8;
              uVar23 = local_d8;
              pcVar15 = local_118;
              local_124 = uc2;
            }
            else {
              if (pcVar18 < pcVar17 + uVar16) {
                as->length = (long)pcVar17 - (long)as->s;
                paVar6 = archive_string_ensure
                                   (as,local_120 * local_100 + local_f0 + as->buffer_length);
                if (paVar6 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar17 = as->s + as->length;
                pcVar18 = as->s + local_e8 + as->buffer_length;
                uVar13 = (undefined4)local_b8;
              }
              local_124 = uc2;
              switch(uVar13) {
              case 1:
                goto switchD_004acc4a_caseD_1;
              case 2:
                goto switchD_004acc4a_caseD_2;
              case 3:
                goto switchD_004acc4a_caseD_3;
              case 4:
                goto switchD_004acc4a_caseD_4;
              }
            }
          }
switchD_004acc4a_default:
          local_110 = pcVar15;
          uVar7 = uVar23 & 0xffffffff;
          pcVar12 = pcVar12 + uVar20;
          sVar11 = local_120;
        }
        else {
          if ((local_124 - 0xac00 < 0x2ba4) && ((local_124 - 0xac00) % 0x1c == 0)) {
            if (uc2 - 0x11a8 < 0x1b) {
              uVar23 = uVar7;
              pcVar15 = (char *)0x0;
              local_124 = (local_124 + uc2) - 0x11a7;
            }
            else {
              if (local_110 == (char *)0x0) {
                lVar22 = local_120 * local_100 + local_f0;
                local_118 = pcVar15;
                local_d8 = uVar23;
                while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,local_124),
                      lVar8 == 0) {
                  as->length = (long)pcVar17 - (long)as->s;
                  paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
                  if (paVar6 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  pcVar17 = as->s + as->length;
                  pcVar18 = as->s + local_e8 + as->buffer_length;
                }
                goto LAB_004aced1;
              }
              if (pcVar18 < pcVar17 + uVar16) {
                as->length = (long)pcVar17 - (long)as->s;
                paVar6 = archive_string_ensure
                                   (as,local_120 * local_100 + local_f0 + as->buffer_length);
                if (paVar6 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar17 = as->s + as->length;
                pcVar18 = as->s + local_e8 + as->buffer_length;
              }
              local_124 = uc2;
              switch((int)local_b8) {
              case 1:
                goto switchD_004acc4a_caseD_1;
              case 2:
                goto switchD_004acc4a_caseD_2;
              case 3:
                goto switchD_004acc4a_caseD_3;
              case 4:
                goto switchD_004acc4a_caseD_4;
              }
            }
            goto switchD_004acc4a_default;
          }
          local_118 = pcVar15;
          local_d8 = uVar23;
          local_d0 = pcVar12 + uVar20;
          local_90 = uVar16;
          uVar4 = get_nfc(local_124,uc2);
          if (uVar4 == 0) {
            if (uVar3 < 0x1d245) {
              bVar2 = ccc_val[ccc_val_index[""[uVar21]][uVar3 >> 4 & 0xf]][uVar3 & 0xf];
              if (bVar2 != 0) {
                ucx[0] = uVar3;
                ccx[0] = (uint)bVar2;
                local_ac = L'\0';
                lVar22 = 4;
                pcVar12 = (char *)0x1;
                uVar7 = (ulong)local_f4;
                pcVar15 = local_d0;
                wVar14 = (uint)bVar2;
                goto LAB_004ad1ad;
              }
            }
            if (local_110 == (char *)0x0) {
              lVar22 = local_120 * local_100 + local_f0;
              while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,uVar5), lVar8 == 0) {
                as->length = (long)pcVar17 - (long)as->s;
                paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
                if (paVar6 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar17 = as->s + as->length;
                pcVar18 = as->s + local_e8 + as->buffer_length;
                uVar5 = local_124;
              }
              pcVar17 = pcVar17 + lVar8;
            }
            else {
              if (pcVar18 < pcVar17 + local_90) {
                as->length = (long)pcVar17 - (long)as->s;
                paVar6 = archive_string_ensure
                                   (as,local_120 * local_100 + local_f0 + as->buffer_length);
                if (paVar6 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar17 = as->s + as->length;
                pcVar18 = as->s + local_e8 + as->buffer_length;
              }
              switch((int)local_b8) {
              case 4:
                cVar1 = *local_110;
                local_110 = local_110 + 1;
                *pcVar17 = cVar1;
                pcVar17 = pcVar17 + 1;
              case 3:
                cVar1 = *local_110;
                local_110 = local_110 + 1;
                *pcVar17 = cVar1;
                pcVar17 = pcVar17 + 1;
              case 2:
                cVar1 = *local_110;
                local_110 = local_110 + 1;
                *pcVar17 = cVar1;
                pcVar17 = pcVar17 + 1;
              case 1:
                *pcVar17 = *local_110;
                pcVar17 = pcVar17 + 1;
              }
            }
            local_124 = uc2;
            uVar7 = local_d8 & 0xffffffff;
            local_110 = local_118;
            pcVar12 = local_d0;
            sVar11 = local_120;
          }
          else {
            local_110 = (char *)0x0;
            uVar7 = local_b8;
            pcVar12 = local_d0;
            sVar11 = local_120;
            local_124 = uVar4;
          }
        }
      }
      if (-1 < (int)uVar20) {
        if (local_110 == (char *)0x0) {
          lVar22 = sVar11 * local_100 + local_f0;
          while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,local_124), lVar8 == 0) {
            as->length = (long)pcVar17 - (long)as->s;
            paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
            if (paVar6 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pcVar17 = as->s + as->length;
            pcVar18 = as->s + local_e8 + as->buffer_length;
          }
          pcVar17 = pcVar17 + lVar8;
          local_104 = wVar14;
        }
        else {
          if (pcVar18 < pcVar17 + uVar16) {
            as->length = (long)pcVar17 - (long)as->s;
            paVar6 = archive_string_ensure(as,sVar11 * local_100 + local_f0 + as->buffer_length);
            if (paVar6 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pcVar17 = as->s + as->length;
          }
          local_104 = wVar14;
          switch((int)local_b8) {
          case 4:
            cVar1 = *pcVar15;
            pcVar15 = pcVar15 + 1;
            *pcVar17 = cVar1;
            pcVar17 = pcVar17 + 1;
          case 3:
            cVar1 = *pcVar15;
            pcVar15 = pcVar15 + 1;
            *pcVar17 = cVar1;
            pcVar17 = pcVar17 + 1;
          case 2:
            cVar1 = *pcVar15;
            pcVar15 = pcVar15 + 1;
            *pcVar17 = cVar1;
            pcVar17 = pcVar17 + 1;
          case 1:
            *pcVar17 = *pcVar15;
            pcVar17 = pcVar17 + 1;
          }
        }
        goto switchD_004ad891_default;
      }
      if (local_110 == (char *)0x0) {
        lVar22 = sVar11 * local_100 + local_f0;
        local_d8 = uVar23;
        while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,local_124), lVar8 == 0) {
          as->length = (long)pcVar17 - (long)as->s;
          paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
          if (paVar6 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          pcVar17 = as->s + as->length;
          pcVar18 = as->s + local_e8 + as->buffer_length;
        }
        pcVar17 = pcVar17 + lVar8;
      }
      else {
        local_d8 = uVar23;
        if (pcVar18 < pcVar17 + uVar16) {
          as->length = (long)pcVar17 - (long)as->s;
          paVar6 = archive_string_ensure(as,sVar11 * local_100 + local_f0 + as->buffer_length);
          if (paVar6 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          pcVar17 = as->s + as->length;
          pcVar18 = as->s + local_e8 + as->buffer_length;
        }
        switch((int)local_b8) {
        case 1:
          pcVar15 = local_110;
          goto LAB_004ad110;
        case 2:
          pcVar15 = local_110;
          goto LAB_004ad104;
        case 3:
          pcVar15 = local_110;
          break;
        case 4:
          *pcVar17 = *local_110;
          pcVar17 = pcVar17 + 1;
          pcVar15 = local_110 + 1;
          break;
        default:
          goto switchD_004ad06d_default;
        }
        *pcVar17 = *pcVar15;
        pcVar17 = pcVar17 + 1;
        pcVar15 = pcVar15 + 1;
LAB_004ad104:
        *pcVar17 = *pcVar15;
        pcVar17 = pcVar17 + 1;
        pcVar15 = pcVar15 + 1;
LAB_004ad110:
        *pcVar17 = *pcVar15;
        pcVar17 = pcVar17 + 1;
      }
switchD_004ad06d_default:
      lVar22 = sVar11 * local_100 + local_f0;
      while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,uc2), lVar8 == 0) {
        as->length = (long)pcVar17 - (long)as->s;
        paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar18 = as->s + local_e8 + as->buffer_length;
      }
      pcVar17 = pcVar17 + lVar8;
      pcVar12 = pcVar12 + (uint)-(int)local_d8;
      sVar11 = sVar11 - (uint)-(int)local_d8;
    }
    local_104 = L'\xffffffff';
  } while( true );
LAB_004ad1ad:
  if (pcVar12 == (char *)0xa) goto LAB_004ad279;
  local_d0 = (char *)lVar22;
  local_f4 = (*local_a8)((long)ucx + lVar22,pcVar15,local_120);
  if ((int)local_f4 < 1) goto LAB_004ad28a;
  uVar20 = ucx[(long)pcVar12];
  local_ac = L'\0';
  if (uVar20 < 0x1d245) {
    local_ac = (wchar_t)ccc_val[ccc_val_index[""[uVar20 >> 8]][uVar20 >> 4 & 0xf]][uVar20 & 0xf];
  }
  if (((local_ac != L'ä') && (wVar14 != L'ä')) && ((uint)local_ac <= (uint)wVar14))
  goto LAB_004ad28a;
  uVar7 = (ulong)local_f4;
  pcVar15 = pcVar15 + uVar7;
  local_120 = local_120 - uVar7;
  ccx[(long)pcVar12] = local_ac;
  pcVar12 = (char *)((long)pcVar12 + 1);
  lVar22 = (long)local_d0 + 4;
  wVar14 = local_ac;
  goto LAB_004ad1ad;
LAB_004ad279:
  local_f4 = (uint)uVar7;
  pcVar12 = (char *)0xa;
LAB_004ad28a:
  bVar25 = 9 < (uint)pcVar12;
  if (bVar25) {
    local_104 = L'\xffffffff';
  }
  if (bVar25) {
    pcVar12 = (char *)10;
  }
  uVar7 = 1;
  local_d0 = pcVar15;
  local_dc = wVar14;
LAB_004ad2a4:
  local_118 = (char *)((ulong)pcVar12 & 0xffffffff);
  local_d8 = CONCAT44(local_d8._4_4_,local_124);
  local_98 = (ulong)((int)pcVar12 - 1);
LAB_004ad2c5:
  puVar24 = ucx + uVar7;
  uVar23 = uVar7;
  while( true ) {
    uVar23 = uVar23 + 1;
    uVar20 = (uint)uVar7;
    if ((int)local_118 <= (int)uVar20) break;
    uVar5 = get_nfc((wchar_t)local_d8,ucx[uVar7]);
    if (uVar5 != 0) goto LAB_004ad300;
    uVar7 = uVar7 + 1;
    puVar24 = puVar24 + 1;
  }
  if (local_110 == (char *)0x0) {
    lVar22 = local_120 * local_100 + local_f0;
    while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,local_124), lVar8 == 0) {
      as->length = (long)pcVar17 - (long)as->s;
      paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      pcVar17 = as->s + as->length;
      pcVar18 = as->s + local_e8 + as->buffer_length;
    }
    pcVar17 = pcVar17 + lVar8;
  }
  else {
    if (pcVar18 < pcVar17 + local_90) {
      as->length = (long)pcVar17 - (long)as->s;
      paVar6 = archive_string_ensure(as,local_120 * local_100 + local_f0 + as->buffer_length);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      pcVar17 = as->s + as->length;
      pcVar18 = as->s + local_e8 + as->buffer_length;
    }
    switch((int)local_b8) {
    case 1:
      pcVar12 = local_110;
      goto LAB_004ad5fb;
    case 2:
      pcVar12 = local_110;
      goto LAB_004ad5ef;
    case 3:
      pcVar12 = local_110;
      break;
    case 4:
      *pcVar17 = *local_110;
      pcVar17 = pcVar17 + 1;
      pcVar12 = local_110 + 1;
      break;
    default:
      goto switchD_004ad554_default;
    }
    *pcVar17 = *pcVar12;
    pcVar17 = pcVar17 + 1;
    pcVar12 = pcVar12 + 1;
LAB_004ad5ef:
    *pcVar17 = *pcVar12;
    pcVar17 = pcVar17 + 1;
    pcVar12 = pcVar12 + 1;
LAB_004ad5fb:
    *pcVar17 = *pcVar12;
    pcVar17 = pcVar17 + 1;
  }
switchD_004ad554_default:
  lVar22 = local_120 * local_100 + local_f0;
  iVar9 = (int)local_118;
  local_118 = (char *)((ulong)local_118 & 0xffffffff);
  if (iVar9 < 1) {
    local_118 = (char *)0x0;
  }
  for (pcVar12 = (char *)0x0; pcVar12 != local_118; pcVar12 = pcVar12 + 1) {
    while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,ucx[(long)pcVar12]), lVar8 == 0
          ) {
      as->length = (long)pcVar17 - (long)as->s;
      paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      pcVar17 = as->s + as->length;
      pcVar18 = as->s + local_e8 + as->buffer_length;
    }
    pcVar17 = pcVar17 + lVar8;
  }
  pcVar12 = local_d0;
  sVar11 = local_120;
  if (((0 < (int)local_f4) && (local_ac == local_dc)) && (local_120 != 0)) {
    while (local_f4 = (*local_a8)(ucx,local_d0,local_120), pcVar12 = local_d0, sVar11 = local_120,
          0 < (int)local_f4) {
      wVar14 = L'\0';
      if (ucx[0] < 0x1d245) {
        wVar14 = (wchar_t)ccc_val[ccc_val_index[""[ucx[0] >> 8]][ucx[0] >> 4 & 0xf]][ucx[0] & 0xf];
      }
      if (wVar14 < local_dc) break;
      local_d0 = local_d0 + local_f4;
      local_120 = local_120 - local_f4;
      lVar22 = local_120 * local_100 + local_f0;
      while (lVar8 = (*local_c8)(pcVar17,(long)pcVar18 - (long)pcVar17,ucx[0]), lVar8 == 0) {
        as->length = (long)pcVar17 - (long)as->s;
        paVar6 = archive_string_ensure(as,as->buffer_length + lVar22);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar17 = as->s + as->length;
        pcVar18 = as->s + local_e8 + as->buffer_length;
      }
      pcVar17 = pcVar17 + lVar8;
      local_dc = wVar14;
    }
  }
  goto LAB_004ac8cd;
LAB_004ad300:
  local_d8 = CONCAT44(local_d8._4_4_,uVar5);
  for (; (long)uVar23 < (long)(int)local_118; uVar23 = uVar23 + 1) {
    ucx[uVar23 - 1] = ucx[uVar23];
    ccx[uVar23 - 1] = ccx[uVar23];
  }
  local_124 = uVar5;
  if (((1 < (int)local_118) && ((uint)local_98 == uVar20)) &&
     ((0 < (int)local_f4 && (local_ac == local_dc)))) goto LAB_004ad38b;
  local_118 = (char *)(ulong)((int)local_118 - 1);
  local_98 = local_98 - 1;
  local_110 = (char *)0x0;
  uVar7 = 0;
  goto LAB_004ad2c5;
LAB_004ad38b:
  wVar14 = ccx[(int)local_118 - 2];
  uVar23 = 10;
  if (10 < uVar20) {
    uVar23 = uVar7;
  }
  local_118 = (char *)(uVar23 & 0xffffffff);
  sVar11 = local_120;
  while( true ) {
    local_d8 = CONCAT44(local_d8._4_4_,wVar14);
    if (9 < (long)uVar7) break;
    local_f4 = (*local_a8)(puVar24);
    if ((int)local_f4 < 1) {
LAB_004ad491:
      local_118 = (char *)(uVar7 & 0xffffffff);
      break;
    }
    uVar20 = *puVar24;
    wVar14 = L'\0';
    if (uVar20 < 0x1d245) {
      wVar14 = (wchar_t)ccc_val[ccc_val_index[""[uVar20 >> 8]][uVar20 >> 4 & 0xf]][uVar20 & 0xf];
    }
    local_dc = wVar14;
    if (((wVar14 != L'ä') && ((wchar_t)local_d8 != L'ä')) && (wVar14 <= (wchar_t)local_d8))
    goto LAB_004ad491;
    local_d0 = local_d0 + local_f4;
    sVar11 = sVar11 - local_f4;
    ccx[uVar7] = wVar14;
    uVar7 = uVar7 + 1;
    puVar24 = puVar24 + 1;
  }
  if (9 < (int)local_118) {
    local_104 = L'\xffffffff';
  }
  pcVar12 = local_118;
  if (9 < (int)local_118) {
    pcVar12 = (char *)10;
  }
  local_110 = (char *)0x0;
  local_ac = local_dc;
  uVar7 = 0;
  local_dc = (wchar_t)local_d8;
  local_120 = sVar11;
  goto LAB_004ad2a4;
}

Assistant:

static int
archive_string_normalize_C(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr, *uc2ptr;

		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Read second code point. */
		while ((n2 = parse(&uc2, s, len)) > 0) {
			uint32_t ucx[FDC_MAX];
			int ccx[FDC_MAX];
			int cl, cx, i, nx, ucx_size;
			int LIndex,SIndex;
			uint32_t nfc;

			if (n2 == spair || always_replace)
				/* uc2 is converted from a surrogate pair.
			 	 * this should be treated as a changed code. */
				uc2ptr = NULL;
			else
				uc2ptr = s;
			s += n2;
			len -= n2;

			/*
			 * If current second code point is out of decomposable
			 * code points, finding compositions is unneeded.
			 */
			if (!IS_DECOMPOSABLE_BLOCK(uc2)) {
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Try to combine current code points.
			 */
			/*
			 * We have to combine Hangul characters according to
			 * http://uniicode.org/reports/tr15/#Hangul
			 */
			if (0 <= (LIndex = uc - HC_LBASE) &&
			    LIndex < HC_LCOUNT) {
				/*
				 * Hangul Composition.
				 * 1. Two current code points are L and V.
				 */
				int VIndex = uc2 - HC_VBASE;
				if (0 <= VIndex && VIndex < HC_VCOUNT) {
					/* Make syllable of form LV. */
					UPDATE_UC(HC_SBASE +
					    (LIndex * HC_VCOUNT + VIndex) *
					     HC_TCOUNT);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if (0 <= (SIndex = uc - HC_SBASE) &&
			    SIndex < HC_SCOUNT && (SIndex % HC_TCOUNT) == 0) {
				/*
				 * Hangul Composition.
				 * 2. Two current code points are LV and T.
				 */
				int TIndex = uc2 - HC_TBASE;
				if (0 < TIndex && TIndex < HC_TCOUNT) {
					/* Make syllable of form LVT. */
					UPDATE_UC(uc + TIndex);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if ((nfc = get_nfc(uc, uc2)) != 0) {
				/* A composition to current code points
				 * is found. */
				UPDATE_UC(nfc);
				continue;
			} else if ((cl = CCC(uc2)) == 0) {
				/* Clearly 'uc2' the second code point is not
				 * a decomposable code. */
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Collect following decomposable code points.
			 */
			cx = 0;
			ucx[0] = uc2;
			ccx[0] = cl;
			COLLECT_CPS(1);

			/*
			 * Find a composed code in the collected code points.
			 */
			i = 1;
			while (i < ucx_size) {
				int j;

				if ((nfc = get_nfc(uc, ucx[i])) == 0) {
					i++;
					continue;
				}

				/*
				 * nfc is composed of uc and ucx[i].
				 */
				UPDATE_UC(nfc);

				/*
				 * Remove ucx[i] by shifting
				 * following code points.
				 */
				for (j = i; j+1 < ucx_size; j++) {
					ucx[j] = ucx[j+1];
					ccx[j] = ccx[j+1];
				}
				ucx_size --;

				/*
				 * Collect following code points blocked
				 * by ucx[i] the removed code point.
				 */
				if (ucx_size > 0 && i == ucx_size &&
				    nx > 0 && cx == cl) {
					cl =  ccx[ucx_size-1];
					COLLECT_CPS(ucx_size);
				}
				/*
				 * Restart finding a composed code with
				 * the updated uc from the top of the
				 * collected code points.
				 */
				i = 0;
			}

			/*
			 * Apparently the current code points are not
			 * decomposed characters or already composed.
			 */
			WRITE_UC();
			for (i = 0; i < ucx_size; i++)
				UNPARSE(p, endp, ucx[i]);

			/*
			 * Flush out remaining canonical combining characters.
			 */
			if (nx > 0 && cx == cl && len > 0) {
				while ((nx = parse(&ucx[0], s, len))
				    > 0) {
					cx = CCC(ucx[0]);
					if (cl > cx)
						break;
					s += nx;
					len -= nx;
					cl = cx;
					UNPARSE(p, endp, ucx[0]);
				}
			}
			break;
		}
		if (n2 < 0) {
			WRITE_UC();
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc2);
			s += n2*-1;
			len -= n2*-1;
			ret = -1;
			continue;
		} else if (n2 == 0) {
			WRITE_UC();
			break;
		}
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}